

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

bool __thiscall
mapbox::detail::Earcut<unsigned_int>::isValidDiagonal(Earcut<unsigned_int> *this,Node *a,Node *b)

{
  double dVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (((a->next->i != b->i) && (a->prev->i != b->i)) &&
     (bVar2 = intersectsPolygon(this,a,b), !bVar2)) {
    bVar2 = locallyInside(this,a,b);
    if (((bVar2) && (bVar2 = locallyInside(this,b,a), bVar2)) &&
       (bVar2 = middleInside(this,a,b), bVar2)) {
      dVar4 = b->prev->x;
      dVar1 = b->prev->y;
      dVar5 = dVar4 - a->x;
      dVar3 = dVar1 - a->y;
      dVar6 = (a->y - a->prev->y) * dVar5 - (a->x - a->prev->x) * dVar3;
      if (dVar6 != 0.0) {
        return true;
      }
      if (NAN(dVar6)) {
        return true;
      }
      dVar4 = dVar3 * (b->x - dVar4) - (b->y - dVar1) * dVar5;
      if (dVar4 != 0.0) {
        return true;
      }
      if (NAN(dVar4)) {
        return true;
      }
    }
    dVar4 = a->x;
    dVar1 = b->x;
    if ((dVar4 == dVar1) && (!NAN(dVar4) && !NAN(dVar1))) {
      if ((a->y == b->y) &&
         ((!NAN(a->y) && !NAN(b->y) &&
          (0.0 < (a->next->x - dVar4) * (a->y - a->prev->y) -
                 (a->next->y - a->y) * (dVar4 - a->prev->x))))) {
        return 0.0 < (b->next->x - dVar1) * (b->y - b->prev->y) -
                     (b->next->y - b->y) * (dVar1 - b->prev->x);
      }
    }
  }
  return false;
}

Assistant:

bool Earcut<N>::isValidDiagonal(Node* a, Node* b) {
    return a->next->i != b->i && a->prev->i != b->i && !intersectsPolygon(a, b) && // dones't intersect other edges
           ((locallyInside(a, b) && locallyInside(b, a) && middleInside(a, b) && // locally visible
            (area(a->prev, a, b->prev) != 0.0 || area(a, b->prev, b) != 0.0)) || // does not create opposite-facing sectors
            (equals(a, b) && area(a->prev, a, a->next) > 0 && area(b->prev, b, b->next) > 0)); // special zero-length case
}